

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

void __thiscall FStateDefinitions::AddStateDefines(FStateDefinitions *this,FStateLabels *list)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  FStateDefine local_58;
  
  if ((list != (FStateLabels *)0x0) && (0 < list->NumLabels)) {
    lVar1 = 0;
    do {
      if (list->Labels[lVar1].Children == (FStateLabels *)0x0) {
        local_58.Label.Index = list->Labels[lVar1].Label.Index;
        uVar2 = (ulong)(this->StateLabels).Count;
        if (uVar2 != 0) {
          lVar3 = 0;
          do {
            if (*(int *)((long)&(((this->StateLabels).Array)->Label).Index + lVar3) ==
                local_58.Label.Index) goto LAB_00547233;
            lVar3 = lVar3 + 0x28;
          } while (uVar2 * 0x28 != lVar3);
        }
        local_58.Children.Array = (FStateDefine *)0x0;
        local_58.Children.Most = 0;
        local_58.Children.Count = 0;
        local_58.State = list->Labels[lVar1].State;
        local_58.DefineFlags = '\x01';
        TArray<FStateDefine,_FStateDefine>::Push(&this->StateLabels,&local_58);
        TArray<FStateDefine,_FStateDefine>::~TArray(&local_58.Children);
      }
LAB_00547233:
      lVar1 = lVar1 + 1;
    } while (lVar1 < list->NumLabels);
  }
  return;
}

Assistant:

void FStateDefinitions::AddStateDefines(const FStateLabels *list)
{
	if (list != NULL) for(int i = 0; i < list->NumLabels; i++)
	{
		if (list->Labels[i].Children == NULL)
		{
			if (!FindStateLabelInList(StateLabels, list->Labels[i].Label, false))
			{
				FStateDefine def;

				def.Label = list->Labels[i].Label;
				def.State = list->Labels[i].State;
				def.DefineFlags = SDF_STATE;
				StateLabels.Push(def);
			}
		}
	}
}